

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILPSolver.cpp
# Opt level: O2

void __thiscall CILPSolver::PrepareCoeffBuffer(CILPSolver *this,int iNumCoeff,int iNumVariable)

{
  int iVar1;
  double *pdVar2;
  int *piVar3;
  int i;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  if (iNumCoeff != 0) {
    lVar6 = (long)iNumCoeff;
    if (this->m_iNumCoeff < iNumCoeff) {
      if (this->m_pCoeff != (double *)0x0) {
        operator_delete__(this->m_pCoeff);
        this->m_pCoeff = (double *)0x0;
      }
      if (this->m_pCoeffIndex != (int *)0x0) {
        operator_delete__(this->m_pCoeffIndex);
        this->m_pCoeffIndex = (int *)0x0;
      }
      this->m_iNumCoeff = iNumCoeff;
      uVar5 = lVar6 * 8 + 8;
      if (iNumCoeff < -1) {
        uVar5 = 0xffffffffffffffff;
      }
      uVar7 = lVar6 * 4 + 4;
      if (iNumCoeff < -1) {
        uVar7 = 0xffffffffffffffff;
      }
      pdVar2 = (double *)operator_new__(uVar5);
      this->m_pCoeff = pdVar2;
      piVar3 = (int *)operator_new__(uVar7);
      this->m_pCoeffIndex = piVar3;
    }
    if (iNumVariable != 0) {
      pdVar2 = this->m_pCoeff;
      for (lVar4 = 0; lVar4 <= lVar6; lVar4 = lVar4 + 1) {
        pdVar2[lVar4] = 1.0;
      }
      piVar3 = this->m_pCoeffIndex;
      for (iVar1 = (iNumVariable - iNumCoeff) + 2; piVar3 = piVar3 + 1, iVar1 <= iNumVariable;
          iVar1 = iVar1 + 1) {
        *piVar3 = iVar1;
      }
    }
    return;
  }
  __assert_fail("iNumCoeff",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/ILPSolver.cpp"
                ,0x1ed,"void CILPSolver::PrepareCoeffBuffer(int, int)");
}

Assistant:

void CILPSolver::PrepareCoeffBuffer(int iNumCoeff, int iNumVariable)
{
	assert(iNumCoeff);

	if(iNumCoeff>m_iNumCoeff)
	{
		SAFE_DELA(m_pCoeff);
		SAFE_DELA(m_pCoeffIndex);

		m_iNumCoeff		=	iNumCoeff;
		m_pCoeff		=	new	double[m_iNumCoeff+1];
		m_pCoeffIndex	=	new	int[m_iNumCoeff+1];

		assert(m_pCoeff);
		assert(m_pCoeffIndex);
	}

	if(iNumVariable)
	{
		for(int i=0;i<iNumCoeff+1;++i)	m_pCoeff[i]	=	1;
		for(int iIndex=1,i=iNumVariable-iNumCoeff+2;i<=iNumVariable;++i)	m_pCoeffIndex[iIndex++]	=	i;		
	}

#ifdef _DEBUG
	m_pCoeffIndex[0]			=	-99;
	m_pCoeffIndex[m_iNumCoeff]	=	-99;
	m_pCoeff[0]					=	-99;
	m_pCoeff[m_iNumCoeff]		=	-99;
#endif
}